

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::scrollContentsBy(QTreeView *this,int dx,int dy)

{
  QTreeViewPrivate *this_00;
  QHeaderViewPrivate *this_01;
  QWidgetData *pQVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  ScrollMode SVar5;
  int iVar6;
  uint uVar7;
  QScrollBar *pQVar8;
  long lVar9;
  QWidget *this_02;
  uint uVar10;
  uint uVar11;
  int dx_00;
  int i;
  long lVar12;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QBasicTimer::stop();
  bVar3 = QWidget::isRightToLeft((QWidget *)this);
  if (dx == 0) {
    dx_00 = 0;
  }
  else {
    dx_00 = -dx;
    if (!bVar3) {
      dx_00 = dx;
    }
    iVar4 = QHeaderView::offset(this_00->header);
    this_01 = *(QHeaderViewPrivate **)
               &(this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                super_QWidget.field_0x8;
    pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    SVar5 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    QHeaderViewPrivate::setScrollOffset(this_01,pQVar8,SVar5);
    SVar5 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    if (SVar5 == ScrollPerItem) {
      iVar6 = QHeaderView::offset(this_00->header);
      bVar3 = QWidget::isRightToLeft((QWidget *)this);
      dx_00 = iVar4 - iVar6;
      if (bVar3) {
        dx_00 = iVar6 - iVar4;
      }
    }
  }
  iVar4 = this_00->defaultItemHeight;
  if (iVar4 < 1) {
    iVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x1f8))(this,0);
  }
  lVar12 = (this_00->viewItems).d.size;
  if (iVar4 != 0 && lVar12 != 0) {
    pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    lVar9 = (long)((((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1) / iVar4);
    if (lVar12 < lVar9) {
      lVar9 = lVar12;
    }
    uVar10 = -dy;
    if (0 < dy) {
      uVar10 = dy;
    }
    uVar7 = (uint)lVar9;
    uVar11 = -uVar7;
    if (0 < (int)uVar7) {
      uVar11 = uVar7;
    }
    if ((uVar11 < uVar10) &&
       ((pDVar2 = (this_00->super_QAbstractItemViewPrivate).editorIndexHash.d, pDVar2 == (Data *)0x0
        || (pDVar2->size == 0)))) {
      this_02 = (QWidget *)QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QWidget::update(this_02);
      QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      viewport);
      return;
    }
    if (dy == 0) {
      dy = 0;
    }
    else {
      SVar5 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
      if (SVar5 == ScrollPerItem) {
        pQVar8 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
        iVar4 = QAbstractSlider::value(&pQVar8->super_QAbstractSlider);
        lVar12 = (long)(iVar4 + dy);
        if (dy < 0) {
          dy = 0;
          for (; lVar12 < iVar4; lVar12 = lVar12 + 1) {
            if (lVar12 < (this_00->viewItems).d.size) {
              iVar6 = QTreeViewPrivate::itemHeight(this_00,(int)lVar12);
              dy = dy - iVar6;
            }
          }
        }
        else {
          dy = 0;
          while (iVar4 < lVar12) {
            lVar9 = lVar12 + -1;
            bVar3 = lVar12 <= (this_00->viewItems).d.size;
            lVar12 = lVar9;
            if (bVar3) {
              iVar6 = QTreeViewPrivate::itemHeight(this_00,(int)lVar9);
              dy = dy + iVar6;
            }
          }
        }
      }
    }
    QAbstractItemViewPrivate::scrollContentsBy(&this_00->super_QAbstractItemViewPrivate,dx_00,dy);
    return;
  }
  return;
}

Assistant:

void QTreeView::scrollContentsBy(int dx, int dy)
{
    Q_D(QTreeView);

    d->delayedAutoScroll.stop(); // auto scroll was canceled by the user scrolling

    dx = isRightToLeft() ? -dx : dx;
    if (dx) {
        int oldOffset = d->header->offset();
        d->header->d_func()->setScrollOffset(horizontalScrollBar(), horizontalScrollMode());
        if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
            int newOffset = d->header->offset();
            dx = isRightToLeft() ? newOffset - oldOffset : oldOffset - newOffset;
        }
    }

    const int itemHeight = d->defaultItemHeight <= 0 ? sizeHintForRow(0) : d->defaultItemHeight;
    if (d->viewItems.isEmpty() || itemHeight == 0)
        return;

    // guestimate the number of items in the viewport
    int viewCount = d->viewport->height() / itemHeight;
    int maxDeltaY = qMin(d->viewItems.size(), viewCount);
    // no need to do a lot of work if we are going to redraw the whole thing anyway
    if (qAbs(dy) > qAbs(maxDeltaY) && d->editorIndexHash.isEmpty()) {
        verticalScrollBar()->update();
        d->viewport->update();
        return;
    }

    if (dy && verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int currentScrollbarValue = verticalScrollBar()->value();
        int previousScrollbarValue = currentScrollbarValue + dy; // -(-dy)
        int currentViewIndex = currentScrollbarValue; // the first visible item
        int previousViewIndex = previousScrollbarValue;
        dy = 0;
        if (previousViewIndex < currentViewIndex) { // scrolling down
            for (int i = previousViewIndex; i < currentViewIndex; ++i) {
                if (i < d->viewItems.size())
                    dy -= d->itemHeight(i);
            }
        } else if (previousViewIndex > currentViewIndex) { // scrolling up
            for (int i = previousViewIndex - 1; i >= currentViewIndex; --i) {
                if (i < d->viewItems.size())
                    dy += d->itemHeight(i);
            }
        }
    }

    d->scrollContentsBy(dx, dy);
}